

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  byte bVar1;
  byte *s_00;
  char_t *pcVar2;
  bool bVar3;
  gap g;
  gap local_28;
  
  local_28.end = (char_t *)0x0;
  local_28.size = 0;
  do {
    s_00 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[(byte)*s] & 1) == 0) {
      if (((anonymous_namespace)::chartype_table[((byte *)s)[1]] & 1) != 0) {
        s_00 = (byte *)s + 1;
        goto LAB_0011516f;
      }
      if (((anonymous_namespace)::chartype_table[((byte *)s)[2]] & 1) != 0) {
        s_00 = (byte *)s + 2;
        goto LAB_0011516f;
      }
      bVar3 = ((anonymous_namespace)::chartype_table[((byte *)s)[3]] & 1) == 0;
      if (bVar3) {
        s_00 = (byte *)s + 4;
      }
      else {
        s_00 = (byte *)s + 3;
      }
    }
    else {
LAB_0011516f:
      bVar3 = false;
    }
    s = (char_t *)s_00;
    if (!bVar3) {
      bVar1 = *s_00;
      if (bVar1 == 0xd) {
        s = (char_t *)(s_00 + 1);
        *s_00 = 10;
        if (s_00[1] == 10) {
          if ((byte *)local_28.end != (byte *)0x0) {
            if (s < local_28.end) {
              __assert_fail("s >= end",
                            "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                            ,0x974,
                            "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
            }
            memmove(local_28.end + -local_28.size,local_28.end,(long)s - (long)local_28.end);
          }
          s = (char_t *)(s_00 + 2);
          local_28.size = local_28.size + 1;
          local_28.end = s;
        }
      }
      else if (bVar1 == 0x26) {
        s = strconv_escape((char_t *)s_00,&local_28);
      }
      else {
        if (bVar1 == 0) {
          pcVar2 = gap::flush(&local_28,(char_t *)s_00);
          *pcVar2 = '\0';
          return (char_t *)s_00;
        }
        if (bVar1 == 0x3c) {
          pcVar2 = gap::flush(&local_28,(char_t *)s_00);
          *pcVar2 = '\0';
          return (char_t *)(s_00 + 1);
        }
        s = (char_t *)(s_00 + 1);
      }
    }
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}